

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O2

void __thiscall WriteIncludesBase::acceptCustomWidget(WriteIncludesBase *this,DomCustomWidget *node)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d = (node->m_class).d.d;
  local_20.ptr = (node->m_class).d.ptr;
  local_20.size = (node->m_class).d.size;
  if (local_20.d != (Data *)0x0) {
    LOCK();
    ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_20.size != 0) {
    add(this,(QString *)&local_20,node);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptCustomWidget(DomCustomWidget *node)
{
    const QString className = node->elementClass();
    if (!className.isEmpty())
        add(className, node);
}